

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O0

void __thiscall
HSimplexNla::reportArraySparse
          (HSimplexNla *this,string *message,HighsInt offset,HVector *vector,bool force)

{
  undefined8 uVar1;
  uint *puVar2;
  const_reference pvVar3;
  long in_RCX;
  int in_EDX;
  string *in_RSI;
  long *in_RDI;
  byte in_R8B;
  HighsInt iRow_1;
  HighsInt iRow;
  HighsInt en;
  vector<int,_std::allocator<int>_> sorted_index;
  HighsInt num_row;
  string *in_stack_000002b8;
  undefined1 in_stack_000002c7;
  vector<double,_std::allocator<double>_> *in_stack_000002c8;
  HighsInt in_stack_000002d4;
  string *in_stack_000002d8;
  HighsLogOptions *in_stack_000002e0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  difference_type in_stack_fffffffffffffec0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffec8;
  allocator *paVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  int local_100;
  allocator local_f9;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff08;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  string local_d8 [32];
  uint local_b8;
  int local_b4;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  vector<int,_std::allocator<int>_> local_98;
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  int local_28;
  byte local_21;
  long local_20;
  int local_14;
  
  local_21 = in_R8B & 1;
  if (((*(byte *)(in_RDI + 0xf5) & 1) != 0) || (local_21 != 0)) {
    local_28 = *(int *)(*in_RDI + 4);
    if (*(int *)(in_RCX + 4) < 0x1a) {
      local_20 = in_RCX;
      if (*(int *)(in_RCX + 4) < local_28) {
        begin._M_current = (int *)&local_98;
        local_14 = in_EDX;
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        local_a0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        local_b0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        local_a8 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffec8._M_current,in_stack_fffffffffffffec0);
        pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (begin,in_stack_fffffffffffffec8);
        uVar1 = std::__cxx11::string::c_str();
        printf("%s",uVar1);
        for (local_b4 = 0; local_b4 < *(int *)(local_20 + 4); local_b4 = local_b4 + 1) {
          puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_98,(long)local_b4);
          local_b8 = *puVar2;
          if (local_b4 % 5 == 0) {
            printf("\n");
          }
          printf("[%4d ",(ulong)local_b8);
          if (local_14 != 0) {
            printf("(%4d)",(ulong)(local_14 + local_b8));
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                              (long)(int)local_b8);
          printf("%11.4g] ",*pvVar3);
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)begin._M_current);
      }
      else {
        if (0x19 < local_28) {
          std::__cxx11::string::string(local_d8,in_RSI);
          paVar4 = &local_f9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&stack0xffffffffffffff08,"Unknown",paVar4);
          analyseVectorValues(in_stack_000002e0,in_stack_000002d8,in_stack_000002d4,
                              in_stack_000002c8,(bool)in_stack_000002c7,in_stack_000002b8);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
          std::allocator<char>::~allocator((allocator<char> *)&local_f9);
          std::__cxx11::string::~string(local_d8);
          return;
        }
        uVar1 = std::__cxx11::string::c_str();
        printf("%s",uVar1);
        for (local_100 = 0; local_100 < local_28; local_100 = local_100 + 1) {
          if (local_100 % 5 == 0) {
            printf("\n");
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                              (long)local_100);
          printf("%11.4g ",*pvVar3);
        }
      }
    }
    else {
      std::__cxx11::string::string(local_48,in_RSI);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"Unknown",&local_69);
      analyseVectorValues(in_stack_000002e0,in_stack_000002d8,in_stack_000002d4,in_stack_000002c8,
                          (bool)in_stack_000002c7,in_stack_000002b8);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      std::__cxx11::string::~string(local_48);
    }
    printf("\n");
  }
  return;
}

Assistant:

void HSimplexNla::reportArraySparse(const std::string message,
                                    const HighsInt offset,
                                    const HVector* vector,
                                    const bool force) const {
  if (!report_ && !force) return;
  const HighsInt num_row = lp_->num_row_;
  if (vector->count > kReportItemLimit) {
    analyseVectorValues(nullptr, message, num_row, vector->array, true);
  } else if (vector->count < num_row) {
    std::vector<HighsInt> sorted_index = vector->index;
    pdqsort(sorted_index.begin(), sorted_index.begin() + vector->count);
    printf("%s", message.c_str());
    for (HighsInt en = 0; en < vector->count; en++) {
      HighsInt iRow = sorted_index[en];
      if (en % 5 == 0) printf("\n");
      printf("[%4d ", (int)(iRow));
      if (offset) printf("(%4d)", (int)(offset + iRow));
      printf("%11.4g] ", vector->array[iRow]);
    }
  } else {
    if (num_row > kReportItemLimit) {
      analyseVectorValues(nullptr, message, num_row, vector->array, true);
      return;
    }
    printf("%s", message.c_str());
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (iRow % 5 == 0) printf("\n");
      printf("%11.4g ", vector->array[iRow]);
    }
  }
  printf("\n");
}